

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blip_Buffer.cpp
# Opt level: O3

void __thiscall Blip_Impulse_::scale_impulse(Blip_Impulse_ *this,int unit,imp_t *imp_in)

{
  uint uVar1;
  int iVar2;
  imp_t iVar3;
  int iVar4;
  imp_t iVar5;
  imp_t *piVar6;
  int iVar7;
  imp_t *piVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  
  uVar1 = this->res;
  iVar5 = (imp_t)unit;
  piVar6 = imp_in;
  if (1 < uVar1 + 3) {
    iVar7 = (int)uVar1 / 2;
    piVar8 = this->impulse;
    iVar2 = this->width;
    do {
      iVar3 = iVar5;
      if (iVar2 != 0) {
        lVar11 = 0;
        lVar9 = 0;
        iVar4 = unit;
        do {
          uVar10 = ((ulong)piVar8[lVar9] + 0x4000) * (ulong)(uint)unit + 0x4000 >> 0xf;
          iVar4 = (iVar4 + unit) - (int)uVar10;
          piVar6[lVar9] = (imp_t)uVar10;
          lVar9 = lVar9 + 1;
          lVar11 = lVar11 + -2;
        } while (iVar2 != (int)lVar9);
        piVar6 = (imp_t *)((long)piVar6 - lVar11);
        piVar8 = (imp_t *)((long)piVar8 - lVar11);
        iVar3 = (imp_t)iVar4;
      }
      piVar6[~(iVar2 / 2)] = piVar6[~(iVar2 / 2)] + iVar3;
      bVar12 = iVar7 != 0;
      iVar7 = iVar7 + -1;
    } while (bVar12);
    if (2 < (int)uVar1) {
      iVar2 = this->width;
      iVar7 = ((uVar1 >> 1) - 1) * iVar2;
      if (iVar7 != 1) {
        lVar9 = 0;
        lVar11 = 0;
        do {
          piVar6[lVar11] = *(imp_t *)((long)piVar6 + lVar9 + (long)iVar2 * -2 + -4);
          lVar11 = lVar11 + 1;
          lVar9 = lVar9 + -2;
        } while (iVar7 + -1 != (int)lVar11);
        piVar6 = (imp_t *)((long)piVar6 - lVar9);
      }
      *piVar6 = iVar5;
      piVar6 = piVar6 + 1;
      goto LAB_00112a16;
    }
  }
  iVar2 = this->width;
LAB_00112a16:
  *piVar6 = iVar5;
  memcpy(piVar6 + 1,imp_in,(long)(int)(iVar2 * uVar1) * 2 - 2);
  return;
}

Assistant:

void Blip_Impulse_::scale_impulse( int unit, imp_t* imp_in ) const
{
	long offset = ((long) unit << impulse_bits) - impulse_offset * unit +
			(1 << (impulse_bits - 1));
	imp_t* imp = imp_in;
	imp_t* fimp = impulse;
	for ( int n = res / 2 + 1; n--; )
	{
		int error = unit;
		for ( int nn = width; nn--; )
		{
			long a = ((long) *fimp++ * unit + offset) >> impulse_bits;
			error -= a - unit;
			*imp++ = (imp_t) a;
		}
		
		// add error to middle
		imp [-width / 2 - 1] += (imp_t) error;
	}
	
	if ( res > 2 ) {
		// second half is mirror-image
		const imp_t* rev = imp - width - 1;
		for ( int nn = (res / 2 - 1) * width - 1; nn--; )
			*imp++ = *--rev;
		*imp++ = (imp_t) unit;
	}
	
	// copy to odd offset
	*imp++ = (imp_t) unit;
	memcpy( imp, imp_in, (res * width - 1) * sizeof *imp );
}